

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

LY_ERR lyd_validate_unres(lyd_node **tree,lys_module *mod,lyd_type data_type,ly_set *node_when,
                         uint32_t when_xp_opts,ly_set *node_types,ly_set *meta_types,
                         ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,lyd_node **diff)

{
  long *plVar1;
  lyd_node *plVar2;
  lysc_node *plVar3;
  lyd_node *ctx_node;
  LY_ERR LVar4;
  uint uVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  uint uVar8;
  ulong uVar9;
  ly_set *plVar10;
  uint32_t uVar11;
  bool bVar12;
  LY_ERR local_60;
  uint32_t i;
  ly_set *local_58;
  lyd_node **local_50;
  lysc_type *type;
  uint local_3c;
  lys_module *local_38;
  
  local_60 = LY_SUCCESS;
  local_58 = node_types;
  local_50 = tree;
  local_38 = mod;
  if ((ext_val != (ly_set *)0x0) && (uVar11 = ext_val->count, local_60 = LY_SUCCESS, uVar11 != 0)) {
    uVar9 = (ulong)(uVar11 - 1);
    local_60 = LY_SUCCESS;
    do {
      plVar1 = *(long **)(ext_val->field_2).dnodes[uVar9];
      LVar4 = (**(code **)(*(long *)(*plVar1 + 0x18) + 0x40))
                        (plVar1,(ext_val->field_2).dnodes[uVar9]->schema,*local_50,data_type,
                         val_opts,diff);
      if (LVar4 != LY_SUCCESS) {
        if (LVar4 != LY_EVALID) {
          return LVar4;
        }
        local_60 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_val,(uint32_t)uVar9,free);
      uVar9 = uVar9 - 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((ext_node != (ly_set *)0x0) && (uVar11 = ext_node->count, uVar11 != 0)) {
    uVar9 = (ulong)(uVar11 - 1);
    do {
      plVar1 = *(long **)(ext_node->field_2).dnodes[uVar9];
      LVar4 = (**(code **)(*(long *)(*plVar1 + 0x18) + 0x30))
                        (plVar1,(ext_node->field_2).dnodes[uVar9]->schema,val_opts);
      if (LVar4 != LY_SUCCESS) {
        if (LVar4 != LY_EVALID) {
          return LVar4;
        }
        local_60 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_node,(uint32_t)uVar9,free);
      uVar9 = uVar9 - 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if (node_when != (ly_set *)0x0) {
    uVar5 = node_when->count;
    do {
      uVar8 = uVar5;
      if (uVar5 != 0) {
        LVar4 = LY_SUCCESS;
        i = uVar5;
        local_3c = uVar5;
        do {
          i = i - 1;
          plVar2 = (node_when->field_2).dnodes[i];
          ly_log_location(plVar2->schema,plVar2,(char *)0x0,(ly_in *)0x0);
          LVar6 = lyd_validate_node_when
                            (*local_50,plVar2,plVar2->schema,when_xp_opts,(lysc_when **)&type);
          if (LVar6 != LY_EINCOMPLETE) {
            if (LVar6 == LY_EVALID) {
              LVar4 = LY_EVALID;
              LVar6 = LVar4;
              if ((val_opts & 4) == 0) goto LAB_001b4778;
            }
            else {
              if (LVar6 != LY_SUCCESS) {
LAB_001b4778:
                LVar4 = LVar6;
                ly_log_location_revert(1,1,0,0);
                break;
              }
              if (type == (lysc_type *)0x0) {
                plVar2->flags = plVar2->flags | 2;
              }
              else if ((plVar2->flags & 2) == 0) {
                plVar3 = plVar2->schema;
                if ((val_opts & 8) == 0) {
                  if (plVar3 == (lysc_node *)0x0) {
                    plVar7 = (lys_module *)&plVar2[2].schema;
                  }
                  else {
                    plVar7 = plVar3->module;
                  }
                  ly_vlog(plVar7->ctx,(char *)0x0,LYVE_DATA,"When condition \"%s\" not satisfied.",
                          *(undefined8 *)(type->name + 0x28));
                  LVar4 = LY_EVALID;
                  LVar6 = LVar4;
                  if ((val_opts & 4) == 0) goto LAB_001b4778;
                }
                else {
                  if (plVar3 == (lysc_node *)0x0) {
                    plVar7 = (lys_module *)&plVar2[2].schema;
                  }
                  else {
                    plVar7 = plVar3->module;
                  }
                  ly_log(plVar7->ctx,LY_LLWRN,LY_SUCCESS,"When condition \"%s\" not satisfied.",
                         *(undefined8 *)(type->name + 0x28));
                }
              }
              else {
                uVar5 = node_when->count;
                lyd_validate_autodel_node_del
                          (local_50,plVar2,local_38,1,(lyd_node **)0x0,node_when,local_58,diff);
                if (node_when->count < uVar5) {
                  ly_set_contains(node_when,plVar2,&i);
                }
              }
              ly_set_rm_index_ordered(node_when,i,(_func_void_void_ptr *)0x0);
            }
          }
          ly_log_location_revert(1,1,0,0);
        } while (i != 0);
        uVar8 = local_3c;
        if (LVar4 != LY_SUCCESS) {
          if (LVar4 != LY_EVALID) {
            return LVar4;
          }
          local_60 = LY_EVALID;
          if ((val_opts & 4) == 0) {
            return LY_EVALID;
          }
        }
      }
      uVar5 = node_when->count;
    } while (uVar5 < uVar8);
    if ((uVar5 != 0) &&
       (((val_opts & 4) == 0 || (bVar12 = local_60 != LY_EVALID, local_60 = LY_EVALID, bVar12)))) {
      __assert_fail("!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x1ee,
                    "LY_ERR lyd_validate_unres(struct lyd_node **, const struct lys_module *, enum lyd_type, struct ly_set *, uint32_t, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, uint32_t, struct lyd_node **)"
                   );
    }
  }
  if ((local_58 != (ly_set *)0x0) && (uVar11 = local_58->count, uVar11 != 0)) {
    uVar9 = (ulong)(uVar11 - 1);
    plVar10 = local_58;
    do {
      plVar2 = (plVar10->field_2).dnodes[uVar9];
      plVar3 = plVar2->schema[1].parent;
      ly_log_location((lysc_node *)0x0,plVar2,(char *)0x0,(ly_in *)0x0);
      if (plVar2->schema == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&plVar2[2].schema;
      }
      else {
        plVar7 = plVar2->schema->module;
      }
      LVar4 = lyd_value_validate_incomplete
                        (plVar7->ctx,(lysc_type *)plVar3,(lyd_value *)(plVar2 + 1),plVar2,*local_50)
      ;
      ly_log_location_revert(0,1,0,0);
      plVar10 = local_58;
      if (LVar4 != LY_SUCCESS) {
        if (LVar4 != LY_EVALID) {
          return LVar4;
        }
        local_60 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(local_58,(uint32_t)uVar9,(_func_void_void_ptr *)0x0);
      uVar9 = uVar9 - 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((meta_types != (ly_set *)0x0) && (uVar11 = meta_types->count, uVar11 != 0)) {
    uVar9 = (ulong)(uVar11 - 1);
    do {
      plVar2 = (meta_types->field_2).dnodes[uVar9];
      lyplg_ext_get_storage((lysc_ext_instance *)plVar2->parent,0x2e0000,8,&type);
      ctx_node = *(lyd_node **)plVar2;
      if (ctx_node->schema == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&ctx_node[2].schema;
      }
      else {
        plVar7 = ctx_node->schema->module;
      }
      LVar4 = lyd_value_validate_incomplete
                        (plVar7->ctx,type,(lyd_value *)&plVar2->prev,ctx_node,*local_50);
      if (LVar4 != LY_SUCCESS) {
        if (LVar4 != LY_EVALID) {
          return LVar4;
        }
        local_60 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(meta_types,(uint32_t)uVar9,(_func_void_void_ptr *)0x0);
      uVar9 = uVar9 - 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return local_60;
}

Assistant:

LY_ERR
lyd_validate_unres(struct lyd_node **tree, const struct lys_module *mod, enum lyd_type data_type, struct ly_set *node_when,
        uint32_t when_xp_opts, struct ly_set *node_types, struct ly_set *meta_types, struct ly_set *ext_node,
        struct ly_set *ext_val, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    uint32_t i;

    if (ext_val && ext_val->count) {
        /* first validate parsed extension data */
        i = ext_val->count;
        do {
            --i;

            struct lyd_ctx_ext_val *ext_v = ext_val->objs[i];

            /* validate extension data */
            r = ext_v->ext->def->plugin->validate(ext_v->ext, ext_v->sibling, *tree, data_type, val_opts, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_val, i, free);
        } while (i);
    }

    if (ext_node && ext_node->count) {
        /* validate data nodes with extension instances */
        i = ext_node->count;
        do {
            --i;

            struct lyd_ctx_ext_node *ext_n = ext_node->objs[i];

            /* validate the node */
            r = ext_n->ext->def->plugin->node(ext_n->ext, ext_n->node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_node, i, free);
        } while (i);
    }

    if (node_when) {
        /* evaluate all when conditions */
        uint32_t prev_count;

        do {
            prev_count = node_when->count;
            r = lyd_validate_unres_when(tree, mod, node_when, val_opts, when_xp_opts, node_types, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* there must have been some when conditions resolved */
        } while (prev_count > node_when->count);

        /* there could have been no cyclic when dependencies, checked during compilation */
        assert(!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR)));
    }

    if (node_types && node_types->count) {
        /* finish incompletely validated terminal values (traverse from the end for efficient set removal) */
        i = node_types->count;
        do {
            --i;

            struct lyd_node_term *node = node_types->objs[i];
            struct lysc_type *type = ((struct lysc_node_leaf *)node->schema)->type;

            /* resolve the value of the node */
            LOG_LOCSET(NULL, &node->node);
            r = lyd_value_validate_incomplete(LYD_CTX(node), type, &node->value, &node->node, *tree);
            LOG_LOCBACK(0, 1);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this node from the set */
            ly_set_rm_index(node_types, i, NULL);
        } while (i);
    }

    if (meta_types && meta_types->count) {
        /* ... and metadata values */
        i = meta_types->count;
        do {
            --i;

            struct lyd_meta *meta = meta_types->objs[i];
            struct lysc_type *type;

            /* validate and store the value of the metadata */
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            r = lyd_value_validate_incomplete(LYD_CTX(meta->parent), type, &meta->value, meta->parent, *tree);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this attr from the set */
            ly_set_rm_index(meta_types, i, NULL);
        } while (i);
    }

cleanup:
    return rc;
}